

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long in_FS_OFFSET;
  int local_13c;
  string local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  long local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined8 local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  long local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  undefined8 local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined8 local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    iVar1 = close(*(int *)((long)child_arg + 8));
    if (iVar1 != -1) {
      UnitTest::GetInstance();
      iVar1 = chdir(((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                    _M_dataplus._M_p);
      if (iVar1 != 0) {
        paVar9 = &local_a8;
        local_b8 = paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"chdir(\"","");
        puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
        paVar10 = &local_88;
        local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar3;
        psVar5 = puVar3 + 2;
        if (local_98 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_88._M_allocated_capacity = *psVar5;
          local_88._8_8_ = puVar3[3];
          local_98 = paVar10;
        }
        else {
          local_88._M_allocated_capacity = *psVar5;
        }
        local_90 = puVar3[1];
        *puVar3 = psVar5;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
        paVar7 = &local_68;
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar3;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar3 + 2);
        if (local_78 == paVar8) {
          local_68._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_68._8_8_ = puVar3[3];
          local_78 = paVar7;
        }
        else {
          local_68._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_70 = puVar3[1];
        *puVar3 = paVar8;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        GetLastErrnoDescription_abi_cxx11_();
        uVar6 = 0xf;
        if (local_78 != paVar7) {
          uVar6 = local_68._M_allocated_capacity;
        }
        paVar8 = &local_c8;
        if ((ulong)uVar6 < (ulong)(local_d0 + local_70)) {
          uVar6 = 0xf;
          if (local_d8 != paVar8) {
            uVar6 = local_c8._M_allocated_capacity;
          }
          if ((ulong)uVar6 < (ulong)(local_d0 + local_70)) goto LAB_001a4bab;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_78);
        }
        else {
LAB_001a4bab:
          puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_d8);
        }
        local_58._M_dataplus._M_p = (pointer)*puVar3;
        psVar5 = puVar3 + 2;
        if ((size_type *)local_58._M_dataplus._M_p == psVar5) {
          local_58.field_2._M_allocated_capacity = *psVar5;
          local_58.field_2._8_8_ = puVar3[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar5;
        }
        local_58._M_string_length = puVar3[1];
        *puVar3 = psVar5;
        puVar3[1] = 0;
        *(undefined1 *)psVar5 = 0;
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001a50eb;
        DeathTestAbort(&local_58);
        puVar3 = extraout_RAX;
        local_98 = extraout_RDX;
        goto LAB_001a4dbe;
      }
      execve(**child_arg,*child_arg,_environ);
      paVar10 = &local_e8;
      local_f8 = paVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"execve(","");
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      paVar9 = &local_c8;
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar3;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar3 + 2);
      if (local_d8 == paVar7) {
        local_c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_c8._8_8_ = puVar3[3];
        local_d8 = paVar9;
      }
      else {
        local_c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_d0 = puVar3[1];
      *puVar3 = paVar7;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
      paVar7 = &local_a8;
      local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar3;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar3 + 2);
      if (local_b8 == paVar8) {
        local_a8._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_a8._8_8_ = puVar3[3];
        local_b8 = paVar7;
      }
      else {
        local_a8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      local_b0 = puVar3[1];
      *puVar3 = paVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
      paVar8 = &local_88;
      local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar3;
      psVar5 = puVar3 + 2;
      if (local_98 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_88._M_allocated_capacity = *psVar5;
        local_88._8_8_ = puVar3[3];
        local_98 = paVar8;
      }
      else {
        local_88._M_allocated_capacity = *psVar5;
      }
      local_90 = puVar3[1];
      *puVar3 = psVar5;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
      local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar3;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar3 + 2);
      if (local_78 == paVar4) {
        local_68._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_68._8_8_ = puVar3[3];
        local_78 = &local_68;
      }
      else {
        local_68._M_allocated_capacity = paVar4->_M_allocated_capacity;
      }
      local_70 = puVar3[1];
      *puVar3 = paVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      GetLastErrnoDescription_abi_cxx11_();
      uVar6 = 0xf;
      if (local_78 != &local_68) {
        uVar6 = local_68._M_allocated_capacity;
      }
      if ((ulong)uVar6 < (ulong)(local_110 + local_70)) {
        uVar6 = 0xf;
        if (local_118 != &local_108) {
          uVar6 = local_108._M_allocated_capacity;
        }
        if ((ulong)uVar6 < (ulong)(local_110 + local_70)) goto LAB_001a4d66;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_78);
      }
      else {
LAB_001a4d66:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_118);
      }
      local_58._M_dataplus._M_p = (pointer)*puVar3;
      psVar5 = puVar3 + 2;
      if ((size_type *)local_58._M_dataplus._M_p == psVar5) {
        local_58.field_2._M_allocated_capacity = *psVar5;
        local_58.field_2._8_8_ = puVar3[3];
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        local_58.field_2._M_allocated_capacity = *psVar5;
      }
      local_58._M_string_length = puVar3[1];
      *puVar3 = psVar5;
      puVar3[1] = 0;
      *(undefined1 *)psVar5 = 0;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001a50eb;
      DeathTestAbort(&local_58);
      puVar3 = extraout_RAX_00;
      local_58._M_dataplus._M_p = (pointer)extraout_RDX_00;
      goto LAB_001a4ed5;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  paVar9 = &local_108;
  local_118 = paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"CHECK failed: File ","");
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
  paVar10 = &local_e8;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar3;
  psVar5 = puVar3 + 2;
  if (local_f8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_e8._M_allocated_capacity = *psVar5;
    local_e8._8_8_ = puVar3[3];
    local_f8 = paVar10;
  }
  else {
    local_e8._M_allocated_capacity = *psVar5;
  }
  local_f0 = puVar3[1];
  *puVar3 = psVar5;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
  paVar7 = &local_c8;
  local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar3;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar3 + 2);
  if (local_d8 == paVar8) {
    local_c8._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_c8._8_8_ = puVar3[3];
    local_d8 = paVar7;
  }
  else {
    local_c8._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_d0 = puVar3[1];
  *puVar3 = paVar8;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  local_13c = 0x1d79;
  StreamableToString<int>(&local_138,&local_13c);
  uVar6 = 0xf;
  if (local_d8 != paVar7) {
    uVar6 = local_c8._M_allocated_capacity;
  }
  paVar8 = &local_138.field_2;
  if ((ulong)uVar6 < local_138._M_string_length + local_d0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar8) {
      uVar6 = local_138.field_2._M_allocated_capacity;
    }
    if (local_138._M_string_length + local_d0 <= (ulong)uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_d8);
      goto LAB_001a4c2e;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_138._M_dataplus._M_p);
LAB_001a4c2e:
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar3;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar3 + 2);
  if (local_b8 == paVar4) {
    local_a8._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_a8._8_8_ = puVar3[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_b0 = puVar3[1];
  *puVar3 = paVar4;
  puVar3[1] = 0;
  paVar4->_M_local_buf[0] = '\0';
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
  local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar3;
  psVar5 = puVar3 + 2;
  if (local_98 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_88._M_allocated_capacity = *psVar5;
    local_88._8_8_ = puVar3[3];
    local_98 = &local_88;
  }
  else {
LAB_001a4dbe:
    local_88._M_allocated_capacity = *psVar5;
  }
  local_90 = puVar3[1];
  *puVar3 = psVar5;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
  local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar3;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar3 + 2);
  if (local_78 == paVar4) {
    local_68._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_68._8_8_ = puVar3[3];
    local_78 = &local_68;
  }
  else {
    local_68._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_70 = puVar3[1];
  *puVar3 = paVar4;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
  local_58._M_dataplus._M_p = (pointer)*puVar3;
  psVar5 = puVar3 + 2;
  if ((size_type *)local_58._M_dataplus._M_p == psVar5) {
    local_58.field_2._M_allocated_capacity = *psVar5;
    local_58.field_2._8_8_ = puVar3[3];
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
LAB_001a4ed5:
    local_58.field_2._M_allocated_capacity = *psVar5;
  }
  local_58._M_string_length = puVar3[1];
  *puVar3 = psVar5;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    DeathTestAbort(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar8) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if (local_d8 != paVar7) {
      operator_delete(local_d8);
    }
    if (local_f8 != paVar10) {
      operator_delete(local_f8);
    }
    if (local_118 != paVar9) {
      operator_delete(local_118);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(extraout_RAX_01);
    }
  }
LAB_001a50eb:
  __stack_chk_fail();
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
			ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
			GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

			// We need to execute the test program in the same environment where
			// it was originally invoked.  Therefore we change to the original
			// working directory first.
			const char* const original_dir =
				UnitTest::GetInstance()->original_working_dir();
			// We can safely call chdir() as it's a direct system call.
			if (chdir(original_dir) != 0) {
				DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
					GetLastErrnoDescription());
				return EXIT_FAILURE;
			}

			// We can safely call execve() as it's a direct system call.  We
			// cannot use execvp() as it's a libc function and thus potentially
			// unsafe.  Since execve() doesn't search the PATH, the user must
			// invoke the test program via a valid path that contains at least
			// one path separator.
			execve(args->argv[0], args->argv, GetEnviron());
			DeathTestAbort(std::string("execve(") + args->argv[0] + ", ...) in " +
				original_dir + " failed: " +
				GetLastErrnoDescription());
			return EXIT_FAILURE;
		}